

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall chaiscript::exception::eval_error::eval_error(eval_error *this,string *t_why)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *t_why_local;
  eval_error *this_local;
  
  local_18 = t_why;
  t_why_local = (string *)this;
  std::operator+(&local_58,"Error: \"",t_why);
  std::operator+(&local_38,&local_58,"\" ");
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)this = &PTR__eval_error_00876908;
  std::__cxx11::string::string((string *)&this->reason,local_18);
  File_Position::File_Position(&this->start_position);
  std::__cxx11::string::string((string *)&this->filename);
  std::__cxx11::string::string((string *)&this->detail);
  std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::vector
            (&this->call_stack);
  return;
}

Assistant:

explicit eval_error(const std::string &t_why) noexcept
          : std::runtime_error("Error: \"" + t_why + "\" ")
          , reason(t_why) {
      }